

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_nlm.hpp
# Opt level: O0

void __thiscall
poplar::plain_bonsai_nlm<int>::
expand<poplar::plain_bonsai_trie<90u,poplar::hash::vigna_hasher>::node_map>
          (plain_bonsai_nlm<int> *this,node_map *pos_map)

{
  node_map *pnVar1;
  reference pvVar2;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *this_00;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *in_RDI;
  uint64_t i;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  new_ptrs;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *in_stack_ffffffffffffff88;
  allocator_type *in_stack_ffffffffffffff90;
  node_map *this_01;
  size_type in_stack_ffffffffffffff98;
  node_map *local_48;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  local_28;
  
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::size(in_RDI);
  std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>::
  allocator((allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_> *)
            0x1d38fd);
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::vector(in_RDI,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>::
  ~allocator((allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_> *)
             0x1d391d);
  local_48 = (node_map *)0x0;
  while( true ) {
    this_01 = local_48;
    pnVar1 = (node_map *)
             plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::size
                       ((node_map *)0x1d393a);
    if (pnVar1 <= this_01) break;
    in_stack_ffffffffffffff88 =
         (vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
          *)plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::operator[]
                      (this_01,(uint64_t)in_stack_ffffffffffffff88);
    if (in_stack_ffffffffffffff88 !=
        (vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
         *)0xffffffffffffffff) {
      pvVar2 = std::
               vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
               ::operator[](in_RDI,(size_type)local_48);
      this_00 = (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::operator[]
                          (this_01,(uint64_t)in_stack_ffffffffffffff88);
      std::
      vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
      ::operator[](&local_28,(size_type)this_00);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
                (this_00,pvVar2);
    }
    local_48 = (node_map *)
               ((long)&(local_48->map_).chunks_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::operator=((vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
               *)this_01,in_stack_ffffffffffffff88);
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::~vector((vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
             *)this_01);
  return;
}

Assistant:

void expand(const T& pos_map) {
        std::vector<std::unique_ptr<uint8_t[]>> new_ptrs(ptrs_.size() * 2);
        for (uint64_t i = 0; i < pos_map.size(); ++i) {
            if (pos_map[i] != UINT64_MAX) {
                new_ptrs[pos_map[i]] = std::move(ptrs_[i]);
            }
        }
        ptrs_ = std::move(new_ptrs);
    }